

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_batch_copy_to_file.cpp
# Opt level: O3

SinkNextBatchType __thiscall
duckdb::PhysicalBatchCopyToFile::NextBatch
          (PhysicalBatchCopyToFile *this,ExecutionContext *context,OperatorSinkNextBatchInput *input
          )

{
  GlobalSinkState *gstate_p;
  FixedBatchCopyLocalState *this_00;
  idx_t in_RAX;
  idx_t iVar1;
  optional_idx local_28;
  
  gstate_p = input->global_state;
  this_00 = (FixedBatchCopyLocalState *)input->local_state;
  local_28.index = in_RAX;
  AddLocalBatch(this,context->client,gstate_p,(LocalSinkState *)this_00);
  iVar1 = optional_idx::GetIndex(&(this_00->super_LocalSinkState).partition_info.min_batch_index);
  BatchMemoryManager::UpdateMinBatchIndex((BatchMemoryManager *)(gstate_p + 1),iVar1);
  iVar1 = optional_idx::GetIndex(&(this_00->super_LocalSinkState).partition_info.batch_index);
  optional_idx::optional_idx(&local_28,iVar1);
  (this_00->batch_index).index = local_28.index;
  FixedBatchCopyLocalState::InitializeCollection
            (this_00,context->client,&this->super_PhysicalOperator);
  return READY;
}

Assistant:

SinkNextBatchType PhysicalBatchCopyToFile::NextBatch(ExecutionContext &context,
                                                     OperatorSinkNextBatchInput &input) const {
	auto &lstate = input.local_state;
	auto &state = lstate.Cast<FixedBatchCopyLocalState>();
	auto &gstate = input.global_state.Cast<FixedBatchCopyGlobalState>();
	auto &memory_manager = gstate.memory_manager;

	// add the previously finished batch (if any) to the state
	AddLocalBatch(context.client, gstate, state);

	// update the minimum batch index
	memory_manager.UpdateMinBatchIndex(state.partition_info.min_batch_index.GetIndex());
	state.batch_index = lstate.partition_info.batch_index.GetIndex();

	state.InitializeCollection(context.client, *this);
	return SinkNextBatchType::READY;
}